

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall
GlobOpt::ValueNumberDst(GlobOpt *this,Instr **pInstr,Value *src1Val,Value *src2Val)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  ObjectSymInfo *pOVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  BOOLEAN BVar6;
  ValueType valueType_00;
  BailOutKind BVar7;
  uint sourceContextId;
  uint functionId;
  SymOpnd *pSVar8;
  RegOpnd *pRVar9;
  GlobOptBlockData *pGVar10;
  ProfiledInstr *pPVar11;
  FldInfo *pFVar12;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar13;
  Opnd *pOVar14;
  StackSym *pSVar15;
  Value *pVVar16;
  undefined4 *puVar17;
  Sym *pSVar18;
  ValueType *pVVar19;
  ValueInfo *pVVar20;
  IndirOpnd *pIVar21;
  bool local_1e5;
  bool local_1e4;
  bool local_1e3;
  bool local_1e2;
  bool local_1e1;
  ValueInfo *local_1b0;
  ValueInfo *local_190;
  ValueInfo *local_188;
  PropertySym *local_158;
  PropertySym *localVarSlotList;
  ObjectSymInfo *objectSymInfo;
  StackSym *opndStackSym;
  RegOpnd *regOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_130;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_12e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_12c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_12a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_128;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_126;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_124;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_122;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_120;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_11e;
  BailOutKind local_11c;
  ValueType profiledValueType_2;
  BailOutKind bailOutKind_1;
  BailOutKind local_110;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_10c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_10a;
  BailOutKind bailOutKind;
  ValueType baseValueType;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_102;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_100;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_fe;
  bool local_fb;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_fa;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_f8;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_f6;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_f4;
  bool isLikelyTagged_1;
  ValueType valueType_2;
  ValueType divValueType;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_e6;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_e4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_e2;
  bool local_df;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_de;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_dc;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_da;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_d8;
  bool isLikelyTagged;
  ValueType valueType_1;
  ValueType valueType;
  IntConstantBounds local_cc;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_c4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_c2;
  BVIndex local_c0;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_ba;
  SymID symId;
  ValueInfo *dstValueInfo;
  undefined8 uStack_a8;
  ValueType profiledValueType_1;
  Value *currDstVal;
  Opnd *currDst;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_8e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_8c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_8a;
  ValueType profiledValueType;
  ValueInfo *pVStack_88;
  ValueInfo *src2ValueInfo;
  ValueInfo *src1ValueInfo;
  int32 newMax;
  int32 newMin;
  int32 max2;
  int32 min2;
  int32 max1;
  int32 min1;
  StackSym *src1Sym;
  Opnd *src1;
  Sym *sym;
  Value *dstVal;
  Opnd *dst;
  Instr **instr;
  Value *src2Val_local;
  Value *src1Val_local;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  dst = (Opnd *)pInstr;
  instr = (Instr **)src2Val;
  src2Val_local = src1Val;
  src1Val_local = (Value *)pInstr;
  pInstr_local = (Instr **)this;
  dstVal = (Value *)IR::Instr::GetDst(*pInstr);
  sym = (Sym *)0x0;
  bVar4 = IR::Instr::CallsSetter((Instr *)dst->_vptr_Opnd);
  if (bVar4) {
    return (Value *)0x0;
  }
  if (dstVal == (Value *)0x0) {
    return (Value *)0x0;
  }
  OVar5 = IR::Opnd::GetKind((Opnd *)dstVal);
  if (OVar5 == OpndKindSym) {
    pSVar8 = IR::Opnd::AsSymOpnd((Opnd *)dstVal);
    src1 = (Opnd *)pSVar8->m_sym;
  }
  else {
    if (OVar5 != OpndKindReg) {
      if (OVar5 != OpndKindIndir) {
        return (Value *)0x0;
      }
      return (Value *)0x0;
    }
    pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)dstVal);
    src1 = (Opnd *)pRVar9->m_sym;
    bVar4 = OpCodeAttr::TempNumberProducing(*(OpCode *)(dst->_vptr_Opnd + 6));
    if (bVar4) {
      pGVar10 = CurrentBlockData(this);
      BVSparse<Memory::JitArenaAllocator>::Set(pGVar10->isTempSrc,*(BVIndex *)&src1[1]._vptr_Opnd);
    }
    else {
      bVar4 = OpCodeAttr::TempNumberTransfer(*(OpCode *)(dst->_vptr_Opnd + 6));
      if (bVar4) {
        src1Sym = (StackSym *)IR::Instr::GetSrc1((Instr *)dst->_vptr_Opnd);
        bVar4 = IR::Opnd::IsRegOpnd((Opnd *)src1Sym);
        if (bVar4) {
          pGVar10 = CurrentBlockData(this);
          pBVar1 = pGVar10->isTempSrc;
          pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)src1Sym);
          BVar6 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar1,(pRVar9->m_sym->super_Sym).m_id);
          if (BVar6 != '\0') {
            pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)src1Sym);
            _max1 = pRVar9->m_sym;
            bVar4 = StackSym::IsSingleDef(_max1);
            if (((bVar4) && (((_max1->field_5).m_instrDef)->m_opcode != Add_A)) &&
               (bVar4 = OpCodeAttr::TempNumberProducing(((_max1->field_5).m_instrDef)->m_opcode),
               bVar4)) {
              pGVar10 = CurrentBlockData(this);
              BVSparse<Memory::JitArenaAllocator>::Set
                        (pGVar10->isTempSrc,*(BVIndex *)&src1[1]._vptr_Opnd);
            }
            else {
              pGVar10 = CurrentBlockData(this);
              pBVar1 = pGVar10->isTempSrc;
              pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)src1Sym);
              BVSparse<Memory::JitArenaAllocator>::Clear(pBVar1,(pRVar9->m_sym->super_Sym).m_id);
              pGVar10 = CurrentBlockData(this);
              BVSparse<Memory::JitArenaAllocator>::Clear
                        (pGVar10->isTempSrc,*(BVIndex *)&src1[1]._vptr_Opnd);
            }
            goto LAB_0058bd93;
          }
        }
        pGVar10 = CurrentBlockData(this);
        BVSparse<Memory::JitArenaAllocator>::Clear
                  (pGVar10->isTempSrc,*(BVIndex *)&src1[1]._vptr_Opnd);
      }
      else {
        pGVar10 = CurrentBlockData(this);
        BVSparse<Memory::JitArenaAllocator>::Clear
                  (pGVar10->isTempSrc,*(BVIndex *)&src1[1]._vptr_Opnd);
      }
    }
  }
LAB_0058bd93:
  if (src2Val_local == (Value *)0x0) {
    local_188 = (ValueInfo *)0x0;
  }
  else {
    local_188 = ::Value::GetValueInfo(src2Val_local);
  }
  if (instr == (Instr **)0x0) {
    local_190 = (ValueInfo *)0x0;
  }
  else {
    local_190 = ::Value::GetValueInfo((Value *)instr);
  }
  pVStack_88 = local_190;
  switch(*(int *)(dst->_vptr_Opnd + 6) - 0x1fU & 0xffff) {
  case 0:
    bVar4 = IR::Opnd::IsRegOpnd((Opnd *)dstVal);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1439,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
    pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)dstVal);
    local_10a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(&pRVar9->super_Opnd);
    pVVar16 = NewGenericValue(this,(ValueType)local_10a.field_0,(Opnd *)dstVal);
    return pVVar16;
  case 7:
  case 8:
    ValueType::ValueType((ValueType *)&stack0xffffffffffffff28);
    if (src2Val_local == (Value *)0x0) {
      aStack_d8 = ValueType::Number.field_0;
    }
    else {
      pVVar20 = ::Value::GetValueInfo(src2Val_local);
      pVVar19 = ValueInfo::Type(pVVar20);
      local_da.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToDefiniteAnyNumber(pVVar19);
      aStack_d8.field_0 = local_da.field_0;
    }
    local_dc.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetCanBeTaggedValue((ValueType *)&stack0xffffffffffffff28,true);
    pVVar16 = CreateDstUntransferredValue
                        (this,(ValueType)local_dc.field_0,(Instr *)dst->_vptr_Opnd,src2Val_local,
                         (Value *)instr);
    return pVVar16;
  case 10:
    if (src2Val_local != (Value *)0x0) {
      bVar4 = DoAggressiveIntTypeSpec(this);
      bVar4 = ValueInfo::GetIntValMinMax(local_188,&min2,&max2,bVar4);
      if (bVar4) goto LAB_0058c9af;
    }
    min2 = -0x80000000;
    max2 = 0x7fffffff;
LAB_0058c9af:
    PropagateIntRangeForNot
              (this,min2,max2,(int32 *)((long)&src1ValueInfo + 4),(int32 *)&src1ValueInfo);
    pVVar16 = CreateDstUntransferredIntValue
                        (this,src1ValueInfo._4_4_,(int32)src1ValueInfo,(Instr *)dst->_vptr_Opnd,
                         src2Val_local,(Value *)instr);
    return pVVar16;
  case 0xb:
  case 0xc:
    pVVar16 = NewGenericValue(this,ValueType::String,(Opnd *)dstVal);
    return pVVar16;
  case 0xe:
    ValueType::ValueType((ValueType *)&local_de.field_0);
    if ((((src2Val_local == (Value *)0x0) ||
         (bVar4 = ValueType::IsLikelyNumber(&local_188->super_ValueType), !bVar4)) ||
        (instr == (Instr **)0x0)) ||
       (bVar4 = ValueType::IsLikelyNumber(&pVStack_88->super_ValueType), !bVar4)) {
      if (((src2Val_local != (Value *)0x0) &&
          (bVar4 = ValueType::IsString(&local_188->super_ValueType), bVar4)) ||
         ((instr != (Instr **)0x0 &&
          (bVar4 = ValueType::IsString(&pVStack_88->super_ValueType), bVar4)))) {
        local_de = ValueType::String.field_0;
      }
      else if (((src2Val_local == (Value *)0x0) ||
               (bVar4 = ValueType::IsNotString(&local_188->super_ValueType), !bVar4)) ||
              ((bVar4 = ValueType::IsPrimitive(&local_188->super_ValueType), !bVar4 ||
               (((instr == (Instr **)0x0 ||
                 (bVar4 = ValueType::IsNotString(&pVStack_88->super_ValueType), !bVar4)) ||
                (bVar4 = ValueType::IsPrimitive(&pVStack_88->super_ValueType), !bVar4)))))) {
        if (((src2Val_local != (Value *)0x0) &&
            (bVar4 = ValueType::IsLikelyString(&local_188->super_ValueType), bVar4)) ||
           ((instr != (Instr **)0x0 &&
            (bVar4 = ValueType::IsLikelyString(&pVStack_88->super_ValueType), bVar4)))) {
          valueType_2 = ValueType::ToLikely(&ValueType::String);
          local_de = valueType_2.field_0.field_0;
        }
        else {
          bVar4 = ValueType::IsUninitialized((ValueType *)&local_de.field_0);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar17 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x1403,"(valueType.IsUninitialized())","valueType.IsUninitialized()"
                              );
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar17 = 0;
          }
        }
      }
      else {
        local_de.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetCanBeTaggedValue(&ValueType::Number,true);
      }
    }
    else {
      bVar4 = ValueType::IsLikelyInt(&local_188->super_ValueType);
      if ((bVar4) && (bVar4 = ValueType::IsLikelyInt(&pVStack_88->super_ValueType), bVar4)) {
        bVar4 = ValueType::IsLikelyTaggedInt(&local_188->super_ValueType);
        local_1e2 = false;
        if (bVar4) {
          local_1e2 = ValueType::IsLikelyTaggedInt(&pVStack_88->super_ValueType);
        }
        local_df = local_1e2;
        bVar4 = ValueType::IsNumber(&local_188->super_ValueType);
        if ((bVar4) && (bVar4 = ValueType::IsNumber(&pVStack_88->super_ValueType), bVar4)) {
          local_e2.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               ValueType::GetNumberAndLikelyInt((bool)(local_df & 1));
          local_de.field_0 = local_e2.field_0;
        }
        else {
          local_e6.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               ValueType::GetInt((bool)(local_df & 1));
          local_e4.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               ValueType::ToLikely((ValueType *)&local_e6.field_0);
          local_de.field_0 = local_e4.field_0;
        }
      }
      else {
        bVar4 = ValueType::IsNumber(&local_188->super_ValueType);
        if ((bVar4) && (bVar4 = ValueType::IsNumber(&pVStack_88->super_ValueType), bVar4)) {
          bVar4 = ValueType::IsFloat(&local_188->super_ValueType);
          if ((bVar4) || (bVar4 = ValueType::IsFloat(&pVStack_88->super_ValueType), bVar4)) {
            local_de.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::SetCanBeTaggedValue(&ValueType::Float,true);
          }
          else {
            local_de.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::SetCanBeTaggedValue(&ValueType::Number,true);
          }
        }
        else {
          bVar4 = ValueType::IsLikelyFloat(&local_188->super_ValueType);
          if ((bVar4) || (bVar4 = ValueType::IsLikelyFloat(&pVStack_88->super_ValueType), bVar4)) {
            local_de.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::ToLikely(&ValueType::Float);
          }
          else {
            local_de.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::ToLikely(&ValueType::Number);
          }
        }
      }
    }
    aStack_f4.field_0 = local_de.field_0;
    pVVar16 = CreateDstUntransferredValue
                        (this,(ValueType)local_de.field_0,(Instr *)dst->_vptr_Opnd,src2Val_local,
                         (Value *)instr);
    return pVVar16;
  case 0xf:
    local_f6.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         GetDivValueType(this,(Instr *)dst->_vptr_Opnd,src2Val_local,(Value *)instr,false);
    bVar4 = ValueType::IsLikelyInt((ValueType *)&local_f6.field_0);
    if ((bVar4) || (bVar4 = ValueType::IsFloat((ValueType *)&local_f6.field_0), bVar4)) {
      local_f8.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetCanBeTaggedValue((ValueType *)&local_f6.field_0,true);
      pVVar16 = CreateDstUntransferredValue
                          (this,(ValueType)local_f8.field_0,(Instr *)dst->_vptr_Opnd,src2Val_local,
                           (Value *)instr);
      return pVVar16;
    }
  case 0x11:
  case 0x12:
  case 0x14:
    ValueType::ValueType((ValueType *)&local_fa.field_0);
    if ((((src2Val_local == (Value *)0x0) ||
         (bVar4 = ValueType::IsLikelyInt(&local_188->super_ValueType), !bVar4)) ||
        (instr == (Instr **)0x0)) ||
       ((bVar4 = ValueType::IsLikelyInt(&pVStack_88->super_ValueType), !bVar4 ||
        (*(short *)(dst->_vptr_Opnd + 6) == 0x2e)))) {
      if (((src2Val_local != (Value *)0x0) &&
          (bVar4 = ValueType::IsLikelyFloat(&local_188->super_ValueType), bVar4)) ||
         ((instr != (Instr **)0x0 &&
          (bVar4 = ValueType::IsLikelyFloat(&pVStack_88->super_ValueType), bVar4)))) {
        baseValueType = ValueType::SetCanBeTaggedValue(&ValueType::Float,true);
        local_fa = baseValueType.field_0.field_0;
      }
      else {
        bailOutKind._2_2_ = ValueType::SetCanBeTaggedValue(&ValueType::Number,true);
        local_fa.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             bailOutKind._2_2_;
      }
    }
    else {
      bVar4 = ValueType::IsLikelyTaggedInt(&local_188->super_ValueType);
      local_1e3 = false;
      if (bVar4) {
        bVar4 = ValueType::IsLikelyTaggedInt(&pVStack_88->super_ValueType);
        local_1e4 = true;
        if (!bVar4) {
          local_1e4 = *(short *)(dst->_vptr_Opnd + 6) == 0x31;
        }
        local_1e3 = local_1e4;
      }
      local_fb = local_1e3;
      bVar4 = ValueType::IsNumber(&local_188->super_ValueType);
      if ((bVar4) && (bVar4 = ValueType::IsNumber(&pVStack_88->super_ValueType), bVar4)) {
        local_fe.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::GetNumberAndLikelyInt((bool)(local_fb & 1));
        local_fa.field_0 = local_fe.field_0;
      }
      else {
        local_102.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::GetInt((bool)(local_fb & 1));
        local_100.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::ToLikely((ValueType *)&local_102.field_0);
        local_fa.field_0 = local_100.field_0;
      }
    }
    bailOutKind._0_2_ = local_fa.bits;
    pVVar16 = CreateDstUntransferredValue
                        (this,(ValueType)local_fa.field_0,(Instr *)dst->_vptr_Opnd,src2Val_local,
                         (Value *)instr);
    return pVVar16;
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    if (src2Val_local == (Value *)0x0) {
LAB_0058ca2f:
      min2 = -0x80000000;
      max2 = 0x7fffffff;
    }
    else {
      bVar4 = DoAggressiveIntTypeSpec(this);
      bVar4 = ValueInfo::GetIntValMinMax(local_188,&min2,&max2,bVar4);
      if (!bVar4) goto LAB_0058ca2f;
    }
    pVVar20 = pVStack_88;
    if (instr != (Instr **)0x0) {
      bVar4 = DoAggressiveIntTypeSpec(this);
      bVar4 = ValueInfo::GetIntValMinMax(pVVar20,&newMin,&newMax,bVar4);
      if (bVar4) goto LAB_0058ca87;
    }
    newMin = -0x80000000;
    newMax = 0x7fffffff;
LAB_0058ca87:
    local_1e1 = false;
    if ((*(short *)(dst->_vptr_Opnd + 6) == 0x3a) && (local_1e1 = false, min2 < 0)) {
      IntConstantBounds::IntConstantBounds
                ((IntConstantBounds *)&stack0xffffffffffffff2c,newMin,newMax);
      local_cc = IntConstantBounds::And_0x1f((IntConstantBounds *)&stack0xffffffffffffff2c);
      local_1e1 = IntConstantBounds::Contains(&local_cc,0);
    }
    if (local_1e1 == false) {
      PropagateIntRangeBinary
                (this,(Instr *)dst->_vptr_Opnd,min2,max2,newMin,newMax,
                 (int32 *)((long)&src1ValueInfo + 4),(int32 *)&src1ValueInfo);
      pVVar16 = CreateDstUntransferredIntValue
                          (this,src1ValueInfo._4_4_,(int32)src1ValueInfo,(Instr *)dst->_vptr_Opnd,
                           src2Val_local,(Value *)instr);
      return pVVar16;
    }
    valueType_1 = ValueType::SetCanBeTaggedValue(&ValueType::AnyNumber,true);
    pVVar16 = CreateDstUntransferredValue
                        (this,valueType_1,(Instr *)dst->_vptr_Opnd,src2Val_local,(Value *)instr);
    return pVVar16;
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x8c:
  case 0x8e:
  case 0xc4:
  case 0x1b0:
  case 0x1b1:
  case 0x1b2:
  case 0x1b3:
    local_126 = ValueType::Boolean.field_0;
    pVVar16 = NewGenericValue(this,ValueType::Boolean,(Opnd *)dstVal);
    return pVVar16;
  case 0x24:
    bVar4 = ValueType::IsNumber(&local_188->super_ValueType);
    if (!bVar4) {
      pVVar19 = ValueInfo::Type(local_188);
      local_c4.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToDefiniteAnyNumber(pVVar19);
      local_c2.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetCanBeTaggedValue((ValueType *)&local_c4.field_0,true);
      pVVar16 = NewGenericValue(this,(ValueType)local_c2.field_0,(Opnd *)dstVal);
      return pVVar16;
    }
    sym = (Sym *)ValueNumberTransferDst(this,(Instr *)dst->_vptr_Opnd,src2Val_local);
    break;
  case 0x26:
  case 0x1c5:
  case 0x1da:
  case 0x223:
    goto switchD_0058be2a_caseD_26;
  case 0x2a:
    local_12a = ValueType::Null.field_0;
    pVVar16 = NewGenericValue(this,ValueType::Null,(Opnd *)dstVal);
    return pVVar16;
  case 0x3f:
  case 0x47:
  case 0x49:
  case 0x4b:
  case 0x4d:
  case 0x4f:
  case 0x65:
  case 0x66:
  case 0x6d:
  case 0x1d6:
  case 0x1d7:
    bVar4 = IR::Instr::IsProfiledInstr((Instr *)dst->_vptr_Opnd);
    if (bVar4) {
      pPVar11 = IR::Instr::AsProfiledInstr((Instr *)dst->_vptr_Opnd);
      pFVar12 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                          ((anon_union_8_4_88fdcd80 *)&(pPVar11->u).field_3);
      dstValueInfo._6_2_ = (pFVar12->valueType).field_0.field_0;
      bVar4 = ValueType::IsLikelyInt((ValueType *)((long)&dstValueInfo + 6));
      if (((!bVar4) || (bVar4 = IR::Opnd::IsRegOpnd((Opnd *)dstVal), !bVar4)) ||
         (pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)dstVal),
         (*(uint *)&pRVar9->m_sym->field_0x18 >> 1 & 1) == 0)) {
        if (local_188 == (ValueInfo *)0x0) {
          dstValueInfo._4_2_ = dstValueInfo._6_2_;
          sym = (Sym *)NewGenericValue(this,(ValueType)dstValueInfo._6_2_,(Opnd *)dstVal);
        }
        else {
          bVar4 = ValueType::IsUninitialized(&local_188->super_ValueType);
          if (bVar4) {
            bVar4 = IsLoopPrePass(this);
            if (bVar4) {
              bVar4 = IR::Opnd::IsRegOpnd((Opnd *)dstVal);
              if (bVar4) {
                pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)dstVal);
                bVar4 = StackSym::IsSingleDef(pRVar9->m_sym);
                if (bVar4) goto LAB_0058c458;
              }
              dstValueInfo._2_2_ = dstValueInfo._6_2_;
              sym = (Sym *)NewGenericValue(this,(ValueType)dstValueInfo._6_2_,(Opnd *)dstVal);
            }
            else {
LAB_0058c458:
              paVar13 = &ValueInfo::Type(local_188)->field_0;
              paVar13->field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   dstValueInfo._6_2_;
              pOVar14 = IR::Instr::GetSrc1((Instr *)dst->_vptr_Opnd);
              dstValueInfo._0_2_ = dstValueInfo._6_2_;
              IR::Opnd::SetValueType(pOVar14,(ValueType)dstValueInfo._6_2_);
            }
          }
        }
      }
    }
    if (sym == (Sym *)0x0) {
      sym = (Sym *)ValueNumberTransferDst(this,(Instr *)dst->_vptr_Opnd,src2Val_local);
    }
    bVar4 = IsLoopPrePass(this);
    if (bVar4) break;
    if (sym == (Sym *)0x0) {
      local_1b0 = (ValueInfo *)0x0;
    }
    else {
      local_1b0 = ::Value::GetValueInfo((Value *)sym);
    }
    _symId = local_1b0;
    if (sym != (Sym *)0x0) {
      pSVar18 = ValueInfo::GetSymStore(local_1b0);
      if (pSVar18 != (Sym *)0x0) {
        pSVar18 = ValueInfo::GetSymStore(_symId);
        bVar4 = Sym::IsStackSym(pSVar18);
        if (bVar4) goto LAB_0058c5e7;
      }
      bVar4 = IR::Opnd::IsRegOpnd((Opnd *)dstVal);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar17 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1336,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar17 = 0;
      }
      pVVar20 = _symId;
      pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)dstVal);
      SetSymStoreDirect(this,pVVar20,&pRVar9->m_sym->super_Sym);
    }
LAB_0058c5e7:
    if ((Sym *)src2Val_local != sym) {
      pGVar10 = CurrentBlockData(this);
      pSVar18 = sym;
      pOVar14 = IR::Instr::GetSrc1((Instr *)dst->_vptr_Opnd);
      GlobOptBlockData::SetValue(pGVar10,(Value *)pSVar18,pOVar14);
    }
    break;
  case 0x51:
  case 0x53:
  case 0x57:
  case 0x59:
  case 0x5b:
  case 0x137:
  case 0x1d8:
  case 0x1d9:
    bVar4 = DoFieldCopyProp(this);
    if (!bVar4) {
      return (Value *)0x0;
    }
    if (src2Val_local == (Value *)0x0) {
      return (Value *)0x0;
    }
    if (instr != (Instr **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1361,"(!src2Val)","Bad src Values...");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
    bVar4 = Sym::IsPropertySym((Sym *)src1);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1363,"(sym->IsPropertySym())","sym->IsPropertySym()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
    local_c0 = *(BVIndex *)&src1[1]._vptr_Opnd;
    if ((*(short *)(dst->_vptr_Opnd + 6) != 0x1f7) && (*(short *)(dst->_vptr_Opnd + 6) != 0x1f8)) {
      pGVar10 = CurrentBlockData(this);
      BVar6 = BVSparse<Memory::JitArenaAllocator>::Test(pGVar10->liveFields,local_c0);
      if (BVar6 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar17 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1365,
                           "(instr->m_opcode == Js::OpCode::StSlot || instr->m_opcode == Js::OpCode::StSlotChkUndecl || !CurrentBlockData()->liveFields->Test(symId))"
                           ,
                           "instr->m_opcode == Js::OpCode::StSlot || instr->m_opcode == Js::OpCode::StSlotChkUndecl || !CurrentBlockData()->liveFields->Test(symId)"
                          );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar17 = 0;
      }
    }
    pGVar10 = CurrentBlockData(this);
    BVSparse<Memory::JitArenaAllocator>::Set(pGVar10->liveFields,local_c0);
    bVar4 = IsLoopPrePass(this);
    if ((!bVar4) && (bVar4 = IR::Opnd::GetIsDead((Opnd *)dstVal), bVar4)) {
      pSVar8 = IR::Opnd::AsSymOpnd((Opnd *)dstVal);
      EndFieldLifetime(this,pSVar8);
    }
    sym = (Sym *)ValueNumberTransferDst(this,(Instr *)dst->_vptr_Opnd,src2Val_local);
    break;
  case 0x78:
    sym = (Sym *)ValueNumberLdElemDst(this,(Instr **)src1Val_local,src2Val_local);
    pOVar14 = IR::Instr::GetSrc1((Instr *)dst->_vptr_Opnd);
    pIVar21 = IR::Opnd::AsIndirOpnd(pOVar14);
    pRVar9 = IR::IndirOpnd::GetBaseOpnd(pIVar21);
    local_10c.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(&pRVar9->super_Opnd);
    bVar4 = ValueType::IsLikelyNativeArray((ValueType *)&local_10c.field_0);
    if (bVar4) {
      pOVar14 = IR::Instr::GetDst((Instr *)dst->_vptr_Opnd);
      bVar4 = IR::Opnd::IsVar(pOVar14);
      if ((bVar4) && (bVar4 = IR::Instr::HasBailOutInfo((Instr *)dst->_vptr_Opnd), bVar4)) {
        local_110 = IR::Instr::GetBailOutKind((Instr *)dst->_vptr_Opnd);
        BVar7 = IR::operator&(local_110,BailOutOnArrayAccessHelperCall);
        if (BVar7 != BailOutInvalid) {
          IR::operator-=(&local_110,0x20000);
        }
        if (local_110 == BailOutOnImplicitCallsPreOp) {
          IR::operator-=(&local_110,5);
        }
        if (local_110 == BailOutInvalid) {
          IR::Instr::ClearBailOutInfo((Instr *)dst->_vptr_Opnd);
        }
        else {
          IR::Instr::SetBailOutKind((Instr *)dst->_vptr_Opnd,local_110);
        }
      }
    }
    return (Value *)sym;
  case 0x7a:
    bailOutKind_1._0_2_ = ValueType::GetObject(Object);
    bailOutKind_1._2_2_ = ValueType::ToLikely((ValueType *)&bailOutKind_1);
    sym = (Sym *)NewGenericValue(this,(ValueType)bailOutKind_1._2_2_,(Opnd *)dstVal);
    pOVar14 = IR::Instr::GetSrc1((Instr *)dst->_vptr_Opnd);
    pIVar21 = IR::Opnd::AsIndirOpnd(pOVar14);
    pRVar9 = IR::IndirOpnd::GetBaseOpnd(pIVar21);
    profiledValueType_2 = IR::Opnd::GetValueType(&pRVar9->super_Opnd);
    bVar4 = ValueType::IsLikelyNativeArray(&profiledValueType_2);
    local_1e5 = false;
    if (bVar4) {
      local_1e5 = IR::Instr::HasBailOutInfo((Instr *)dst->_vptr_Opnd);
    }
    if (local_1e5 != false) {
      local_11c = IR::Instr::GetBailOutKind((Instr *)dst->_vptr_Opnd);
      BVar7 = IR::operator&(local_11c,BailOutOnArrayAccessHelperCall);
      if (BVar7 != BailOutInvalid) {
        IR::operator-=(&local_11c,0x20000);
      }
      if (local_11c == BailOutOnImplicitCallsPreOp) {
        IR::operator-=(&local_11c,5);
      }
      if (local_11c == BailOutInvalid) {
        IR::Instr::ClearBailOutInfo((Instr *)dst->_vptr_Opnd);
      }
      else {
        IR::Instr::SetBailOutKind((Instr *)dst->_vptr_Opnd,local_11c);
      }
    }
    return (Value *)sym;
  case 0x7b:
  case 0x7d:
    sym = (Sym *)ValueNumberTransferDst(this,(Instr *)dst->_vptr_Opnd,src2Val_local);
    break;
  case 0x87:
    bVar4 = IR::Instr::IsProfiledInstr((Instr *)dst->_vptr_Opnd);
    if (bVar4) {
      pPVar11 = IR::Instr::AsProfiledInstr((Instr *)dst->_vptr_Opnd);
      pFVar12 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                          ((anon_union_8_4_88fdcd80 *)&(pPVar11->u).field_3);
      local_11e.field_0 = (pFVar12->valueType).field_0.field_0;
      bVar4 = ValueType::IsLikelyInt((ValueType *)&local_11e.field_0);
      if ((!bVar4) ||
         (pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)dstVal),
         (*(uint *)&pRVar9->m_sym->field_0x18 >> 1 & 1) == 0)) {
        local_120.field_0 = local_11e.field_0;
        pVVar16 = NewGenericValue(this,(ValueType)local_11e.field_0,(Opnd *)dstVal);
        return pVVar16;
      }
    }
    break;
  case 0x89:
    local_128 = ValueType::Undefined.field_0;
    pVVar16 = NewGenericValue(this,ValueType::Undefined,(Opnd *)dstVal);
    return pVVar16;
  case 0x95:
    sourceContextId = Func::GetSourceContextId(this->func);
    functionId = Func::GetLocalFunctionId(this->func);
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,OptTagChecksPhase,sourceContextId,functionId);
    if ((!bVar4) &&
       ((local_188 == (ValueInfo *)0x0 ||
        (bVar4 = ValueType::IsUninitialized(&local_188->super_ValueType), bVar4)))) {
      local_130.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Object);
      local_12e.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&local_130.field_0);
      local_12c.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetCanBeTaggedValue((ValueType *)&local_12e.field_0,false);
      pVVar16 = NewGenericValue(this,(ValueType)local_12c.field_0,(Opnd *)dstVal);
      return pVVar16;
    }
    break;
  case 199:
  case 0x201:
    bVar4 = IR::Opnd::IsRegOpnd((Opnd *)dstVal);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1497,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
    local_122.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType((Opnd *)dstVal);
    bVar4 = ValueType::IsString((ValueType *)&local_122.field_0);
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1498,"(dst->GetValueType().IsString())","dst->GetValueType().IsString()"
                        );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
    local_124 = ValueType::String.field_0;
    pVVar16 = NewGenericValue(this,ValueType::String,(Opnd *)dstVal);
    return pVVar16;
  case 0xea:
  case 0x209:
    goto switchD_0058be2a_caseD_ea;
  case 0x1c6:
  case 0x1c7:
  case 0x1cc:
    sym = (Sym *)src2Val_local;
    break;
  case 0x1ff:
    pOVar14 = IR::Instr::GetDst((Instr *)dst->_vptr_Opnd);
    if (pOVar14 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x14be,"(instr->GetDst())","instr->GetDst()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
    pOVar14 = IR::Instr::GetDst((Instr *)dst->_vptr_Opnd);
    bVar4 = IR::Opnd::IsRegOpnd(pOVar14);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x14bf,"(instr->GetDst()->IsRegOpnd())","instr->GetDst()->IsRegOpnd()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
    pOVar14 = IR::Instr::GetDst((Instr *)dst->_vptr_Opnd);
    pRVar9 = IR::Opnd::AsRegOpnd(pOVar14);
    pSVar15 = pRVar9->m_sym;
    if (pSVar15 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x14c2,"(opndStackSym != nullptr)","opndStackSym != nullptr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
    pOVar2 = pSVar15->m_objectInfo;
    if (pOVar2 == (ObjectSymInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x14c4,"(objectSymInfo != nullptr)","objectSymInfo != nullptr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
    for (local_158 = pOVar2->m_propertySymList; local_158 != (PropertySym *)0x0;
        local_158 = local_158->m_nextInStackSymList) {
      BVSparse<Memory::JitArenaAllocator>::Set(this->slotSyms,(local_158->super_Sym).m_id);
    }
    break;
  case 0x207:
    if (src2Val_local == (Value *)0x0) {
      local_ba = ValueType::String.field_0;
      src2Val_local = NewGenericValue(this,ValueType::String,(Opnd *)dstVal);
    }
    sym = (Sym *)src2Val_local;
    break;
  case 0x20b:
    goto switchD_0058be2a_caseD_20b;
  case 0x20c:
    pOVar14 = IR::Instr::GetDst((Instr *)dst->_vptr_Opnd);
    local_8a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(pOVar14);
    bVar4 = ValueType::IsString((ValueType *)&local_8a.field_0);
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1296,"(instr->GetDst()->GetValueType().IsString())",
                         "Creator of this instruction should have set the type");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
    bVar4 = IsLoopPrePass(this);
    if (((bVar4) || (local_188 == (ValueInfo *)0x0)) ||
       (bVar4 = ValueType::IsPrimitive(&local_188->super_ValueType), !bVar4)) break;
    *(undefined2 *)(dst->_vptr_Opnd + 6) = 0x109;
switchD_0058be2a_caseD_ea:
    pOVar14 = IR::Instr::GetDst((Instr *)dst->_vptr_Opnd);
    local_8c.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(pOVar14);
    bVar4 = ValueType::IsString((ValueType *)&local_8c.field_0);
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x12a2,"(instr->GetDst()->GetValueType().IsString())",
                         "Creator of this instruction should have set the type");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
    pOVar14 = IR::Instr::GetSrc2((Instr *)dst->_vptr_Opnd);
    if (((pOVar14 != (Opnd *)0x0) && (bVar4 = IsLoopPrePass(this), !bVar4)) &&
       ((local_188 != (ValueInfo *)0x0 &&
        (bVar4 = ValueType::IsString(&local_188->super_ValueType), bVar4)))) {
      IR::Instr::FreeSrc2((Instr *)dst->_vptr_Opnd);
    }
switchD_0058be2a_caseD_20b:
    bVar4 = IsLoopPrePass(this);
    if (((bVar4) || (local_188 == (ValueInfo *)0x0)) ||
       (bVar4 = ValueType::IsString(&local_188->super_ValueType), !bVar4)) break;
    *(undefined2 *)(dst->_vptr_Opnd + 6) = 0x45;
switchD_0058be2a_caseD_26:
    bVar4 = IsLoopPrePass(this);
    if (!bVar4) {
      pOVar14 = IR::Instr::GetSrc1((Instr *)dst->_vptr_Opnd);
      bVar4 = IR::Opnd::IsRegOpnd(pOVar14);
      if (bVar4) {
        pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)dstVal);
        bVar4 = StackSym::IsSingleDef(pRVar9->m_sym);
        if (bVar4) {
          pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)dstVal);
          pSVar15 = pRVar9->m_sym;
          pOVar14 = IR::Instr::GetSrc1((Instr *)dst->_vptr_Opnd);
          pRVar9 = IR::Opnd::AsRegOpnd(pOVar14);
          StackSym::CopySymAttrs(pSVar15,pRVar9->m_sym);
        }
      }
    }
    bVar4 = IR::Instr::IsProfiledInstr((Instr *)dst->_vptr_Opnd);
    if (bVar4) {
      pPVar11 = IR::Instr::AsProfiledInstr((Instr *)dst->_vptr_Opnd);
      pFVar12 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                          ((anon_union_8_4_88fdcd80 *)&(pPVar11->u).field_3);
      local_8e.field_0 = (pFVar12->valueType).field_0.field_0;
      bVar4 = ValueType::IsLikelyInt((ValueType *)&local_8e.field_0);
      if (bVar4) {
        bVar4 = IR::Opnd::IsRegOpnd((Opnd *)dstVal);
        if ((bVar4) &&
           (pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)dstVal),
           (*(uint *)&pRVar9->m_sym->field_0x18 >> 1 & 1) != 0)) goto LAB_0058c222;
        pOVar14 = IR::Instr::GetSrc1((Instr *)dst->_vptr_Opnd);
        bVar4 = IR::Opnd::IsRegOpnd(pOVar14);
        if (bVar4) {
          pOVar14 = IR::Instr::GetSrc1((Instr *)dst->_vptr_Opnd);
          pRVar9 = IR::Opnd::AsRegOpnd(pOVar14);
          if ((*(uint *)&pRVar9->m_sym->field_0x18 >> 1 & 1) != 0) goto LAB_0058c222;
        }
      }
      if (local_188 == (ValueInfo *)0x0) {
        sym = (Sym *)NewGenericValue(this,(ValueType)local_8e.field_0,(Opnd *)dstVal);
      }
      else {
        bVar4 = ValueType::IsUninitialized(&local_188->super_ValueType);
        if (bVar4) {
          bVar4 = IsLoopPrePass(this);
          if (bVar4) {
            sym = (Sym *)NewGenericValue(this,(ValueType)local_8e.field_0,(Opnd *)dstVal);
          }
          else {
            paVar13 = &ValueInfo::Type(local_188)->field_0;
            paVar13->field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_8e;
            pOVar14 = IR::Instr::GetSrc1((Instr *)dst->_vptr_Opnd);
            IR::Opnd::SetValueType(pOVar14,(ValueType)local_8e.field_0);
          }
        }
      }
    }
LAB_0058c222:
    if (sym == (Sym *)0x0) {
      sym = (Sym *)ValueNumberTransferDst(this,(Instr *)dst->_vptr_Opnd,src2Val_local);
    }
    break;
  case 0x251:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar17 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x12fd,"(false)",
                       "CheckFixedFld doesn\'t have a dst, so we should never get here");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar17 = 0;
    break;
  case 600:
    bVar4 = DoCSE(this);
    if (bVar4) {
      pOVar14 = IR::Instr::GetDst((Instr *)dst->_vptr_Opnd);
      pGVar10 = CurrentBlockData(this);
      pSVar15 = IR::Opnd::GetStackSym(pOVar14);
      pVVar16 = GlobOptBlockData::FindValue(pGVar10,&pSVar15->super_Sym);
      if (pVVar16 != (Value *)0x0) {
        return pVVar16;
      }
      uStack_a8 = 0;
    }
  }
  if (sym == (Sym *)0x0) {
    valueType_00 = IR::Opnd::GetValueType((Opnd *)dstVal);
    this_local = (GlobOpt *)NewGenericValue(this,valueType_00,(Opnd *)dstVal);
  }
  else {
    pGVar10 = CurrentBlockData(this);
    this_local = (GlobOpt *)GlobOptBlockData::SetValue(pGVar10,(Value *)sym,(Opnd *)dstVal);
  }
  return (Value *)this_local;
}

Assistant:

Value *
GlobOpt::ValueNumberDst(IR::Instr **pInstr, Value *src1Val, Value *src2Val)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *dst = instr->GetDst();
    Value *dstVal = nullptr;
    Sym *sym;

    if (instr->CallsSetter())
    {
        return nullptr;
    }
    if (dst == nullptr)
    {
        return nullptr;
    }

    switch (dst->GetKind())
    {
    case IR::OpndKindSym:
        sym = dst->AsSymOpnd()->m_sym;
        break;

    case IR::OpndKindReg:
        sym = dst->AsRegOpnd()->m_sym;

        if (OpCodeAttr::TempNumberProducing(instr->m_opcode))
        {
            CurrentBlockData()->isTempSrc->Set(sym->m_id);
        }
        else if (OpCodeAttr::TempNumberTransfer(instr->m_opcode))
        {
            IR::Opnd *src1 = instr->GetSrc1();

            if (src1->IsRegOpnd() && CurrentBlockData()->isTempSrc->Test(src1->AsRegOpnd()->m_sym->m_id))
            {
                StackSym *src1Sym = src1->AsRegOpnd()->m_sym;
                // isTempSrc is used for marking isTempLastUse, which is used to generate AddLeftDead()
                // calls instead of the normal Add helpers. It tells the runtime that concats can use string
                // builders.
                // We need to be careful in the case where src1 points to a string builder and is getting aliased.
                // Clear the bit on src and dst of the transfer instr in this case, unless we can prove src1
                // isn't pointing at a string builder, like if it is single def and the def instr is not an Add,
                // but TempProducing.
                if (src1Sym->IsSingleDef() && src1Sym->m_instrDef->m_opcode != Js::OpCode::Add_A
                    && OpCodeAttr::TempNumberProducing(src1Sym->m_instrDef->m_opcode))
                {
                    CurrentBlockData()->isTempSrc->Set(sym->m_id);
                }
                else
                {
                    CurrentBlockData()->isTempSrc->Clear(src1->AsRegOpnd()->m_sym->m_id);
                    CurrentBlockData()->isTempSrc->Clear(sym->m_id);
                }
            }
            else
            {
                CurrentBlockData()->isTempSrc->Clear(sym->m_id);
            }
        }
        else
        {
            CurrentBlockData()->isTempSrc->Clear(sym->m_id);
        }
        break;

    case IR::OpndKindIndir:
        return nullptr;

    default:
        return nullptr;
    }

    int32 min1, max1, min2, max2, newMin, newMax;
    ValueInfo *src1ValueInfo = (src1Val ? src1Val->GetValueInfo() : nullptr);
    ValueInfo *src2ValueInfo = (src2Val ? src2Val->GetValueInfo() : nullptr);

    switch (instr->m_opcode)
    {
    case Js::OpCode::Conv_PrimStr:
        AssertMsg(instr->GetDst()->GetValueType().IsString(),
            "Creator of this instruction should have set the type");
        if (this->IsLoopPrePass() || src1ValueInfo == nullptr || !src1ValueInfo->IsPrimitive())
        {
            break;
        }
        instr->m_opcode = Js::OpCode::Conv_Str;
        // fall-through
    case Js::OpCode::Conv_Str:
    // This opcode is commented out since we don't track regex information in GlobOpt now.
    //case Js::OpCode::Coerce_Regex:
    case Js::OpCode::Coerce_Str:
        AssertMsg(instr->GetDst()->GetValueType().IsString(),
            "Creator of this instruction should have set the type");

        // Due to fall through and the fact that Ld_A only takes one source,
        // free the other source here.
        if (instr->GetSrc2() && !(this->IsLoopPrePass() || src1ValueInfo == nullptr || !src1ValueInfo->IsString()))
        {
            instr->FreeSrc2();
        }

        // fall-through
    case Js::OpCode::Coerce_StrOrRegex:
        // We don't set the ValueType of src1 for Coerce_StrOrRegex, hence skip the ASSERT
        if (this->IsLoopPrePass() || src1ValueInfo == nullptr || !src1ValueInfo->IsString())
        {
            break;
        }
        instr->m_opcode = Js::OpCode::Ld_A;
        // fall-through

    case Js::OpCode::BytecodeArgOutCapture:
    case Js::OpCode::LdAsmJsFunc:
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:

        // Propagate sym attributes across the reg copy.
        if (!this->IsLoopPrePass() && instr->GetSrc1()->IsRegOpnd())
        {
            if (dst->AsRegOpnd()->m_sym->IsSingleDef())
            {
                dst->AsRegOpnd()->m_sym->CopySymAttrs(instr->GetSrc1()->AsRegOpnd()->m_sym);
            }
        }

        if (instr->IsProfiledInstr())
        {
            const ValueType profiledValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            if(!(
                    profiledValueType.IsLikelyInt() &&
                    (
                        (dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->m_isNotNumber) ||
                        (instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->AsRegOpnd()->m_sym->m_isNotNumber)
                    )
                ))
            {
                if(!src1ValueInfo)
                {
                    dstVal = this->NewGenericValue(profiledValueType, dst);
                }
                else if(src1ValueInfo->IsUninitialized())
                {
                    if(IsLoopPrePass())
                    {
                        dstVal = this->NewGenericValue(profiledValueType, dst);
                    }
                    else
                    {
                        // Assuming the profile data gives more precise value types based on the path it took at runtime, we
                        // can improve the original value type.
                        src1ValueInfo->Type() = profiledValueType;
                        instr->GetSrc1()->SetValueType(profiledValueType);
                    }
                }
            }
        }

        if (dstVal == nullptr)
        {
            // Ld_A is just transferring the value
            dstVal = this->ValueNumberTransferDst(instr, src1Val);
        }

        break;

    case Js::OpCode::ExtendArg_A:
    {
        // SIMD_JS
        // We avoid transforming EAs to Lds to keep the IR shape consistent and avoid CSEing of EAs.
        // CSEOptimize only assigns a Value to the EA dst, and doesn't turn it to a Ld. If this happened, we shouldn't assign a new Value here.
        if (DoCSE())
        {
            IR::Opnd * currDst = instr->GetDst();
            Value * currDstVal = CurrentBlockData()->FindValue(currDst->GetStackSym());
            if (currDstVal != nullptr)
            {
                return currDstVal;
            }
        }
        break;
    }

    case Js::OpCode::CheckFixedFld:
        AssertMsg(false, "CheckFixedFld doesn't have a dst, so we should never get here");
        break;

    case Js::OpCode::LdSlot:
    case Js::OpCode::LdSlotArr:
    case Js::OpCode::LdFld:
    case Js::OpCode::LdFldForTypeOf:
    case Js::OpCode::LdFldForCallApplyTarget:
    // Do not transfer value type on LdRootFldForTypeOf to prevent copy-prop to LdRootFld in case the field doesn't exist since LdRootFldForTypeOf does not throw.
    // Same goes for ScopedLdFldForTypeOf as we'll end up loading the property from the root object if the property is not in the scope chain.
    //case Js::OpCode::LdRootFldForTypeOf:
    //case Js::OpCode::ScopedLdFldForTypeOf:
    case Js::OpCode::LdRootFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::LdRootMethodFld:
    case Js::OpCode::ScopedLdMethodFld:
    case Js::OpCode::LdMethodFromFlags:
    case Js::OpCode::ScopedLdFld:
        if (instr->IsProfiledInstr())
        {
            ValueType profiledValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            if(!(profiledValueType.IsLikelyInt() && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->m_isNotNumber))
            {
                if(!src1ValueInfo)
                {
                    dstVal = this->NewGenericValue(profiledValueType, dst);
                }
                else if(src1ValueInfo->IsUninitialized())
                {
                    if(IsLoopPrePass() && (!dst->IsRegOpnd() || !dst->AsRegOpnd()->m_sym->IsSingleDef()))
                    {
                        dstVal = this->NewGenericValue(profiledValueType, dst);
                    }
                    else
                    {
                        // Assuming the profile data gives more precise value types based on the path it took at runtime, we
                        // can improve the original value type.
                        src1ValueInfo->Type() = profiledValueType;
                        instr->GetSrc1()->SetValueType(profiledValueType);
                    }
                }
            }
        }
        if (dstVal == nullptr)
        {
            dstVal = this->ValueNumberTransferDst(instr, src1Val);
        }

        if(!this->IsLoopPrePass())
        {
            // We cannot transfer value if the field hasn't been copy prop'd because we don't generate
            // an implicit call bailout between those values if we don't have "live fields" unless, we are hoisting the field.
            ValueInfo *dstValueInfo = (dstVal ? dstVal->GetValueInfo() : nullptr);

            // Update symStore if it isn't a stackSym
            if (dstVal && (!dstValueInfo->GetSymStore() || !dstValueInfo->GetSymStore()->IsStackSym()))
            {
                Assert(dst->IsRegOpnd());
                this->SetSymStoreDirect(dstValueInfo, dst->AsRegOpnd()->m_sym);
            }
            if (src1Val != dstVal)
            {
                CurrentBlockData()->SetValue(dstVal, instr->GetSrc1());
            }
        }
        break;

    case Js::OpCode::LdC_A_R8:
    case Js::OpCode::LdC_A_I4:
    case Js::OpCode::ArgIn_A:
        dstVal = src1Val;
        break;

    case Js::OpCode::LdStr:
        if (src1Val == nullptr)
        {
            src1Val = NewGenericValue(ValueType::String, dst);
        }
        dstVal = src1Val;
        break;

    // LdElemUndef only assign undef if the field doesn't exist.
    // So we don't actually know what the value is, so we can't really copy prop it.
    //case Js::OpCode::LdElemUndef:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    case Js::OpCode::InitFld:
    case Js::OpCode::InitComputedProperty:
        if (DoFieldCopyProp())
        {
            if (src1Val == nullptr)
            {
                // src1 may have no value if it's not a valid var, e.g., NULL for let/const initialization.
                // Consider creating generic values for such things.
                return nullptr;
            }
            AssertMsg(!src2Val, "Bad src Values...");

            Assert(sym->IsPropertySym());
            SymID symId = sym->m_id;
            Assert(instr->m_opcode == Js::OpCode::StSlot || instr->m_opcode == Js::OpCode::StSlotChkUndecl || !CurrentBlockData()->liveFields->Test(symId));

            CurrentBlockData()->liveFields->Set(symId);
            if (!this->IsLoopPrePass() && dst->GetIsDead())
            {
                // Take the property sym out of the live fields set (with special handling for loops).
                this->EndFieldLifetime(dst->AsSymOpnd());
            }

            dstVal = this->ValueNumberTransferDst(instr, src1Val);
        }
        else
        {
            return nullptr;
        }
        break;

    case Js::OpCode::Conv_Num:
        if(src1ValueInfo->IsNumber())
        {
            dstVal = ValueNumberTransferDst(instr, src1Val);
        }
        else
        {
            return NewGenericValue(src1ValueInfo->Type().ToDefiniteAnyNumber().SetCanBeTaggedValue(true), dst);
        }
        break;

    case Js::OpCode::Not_A:
    {
        if (!src1Val || !src1ValueInfo->GetIntValMinMax(&min1, &max1, this->DoAggressiveIntTypeSpec()))
        {
            min1 = INT32_MIN;
            max1 = INT32_MAX;
        }

        this->PropagateIntRangeForNot(min1, max1, &newMin, &newMax);
        return CreateDstUntransferredIntValue(newMin, newMax, instr, src1Val, src2Val);
    }

    case Js::OpCode::Xor_A:
    case Js::OpCode::Or_A:
    case Js::OpCode::And_A:
    case Js::OpCode::Shl_A:
    case Js::OpCode::Shr_A:
    case Js::OpCode::ShrU_A:
    {
        if (!src1Val || !src1ValueInfo->GetIntValMinMax(&min1, &max1, this->DoAggressiveIntTypeSpec()))
        {
            min1 = INT32_MIN;
            max1 = INT32_MAX;
        }
        if (!src2Val || !src2ValueInfo->GetIntValMinMax(&min2, &max2, this->DoAggressiveIntTypeSpec()))
        {
            min2 = INT32_MIN;
            max2 = INT32_MAX;
        }

        if (instr->m_opcode == Js::OpCode::ShrU_A &&
            min1 < 0 &&
            IntConstantBounds(min2, max2).And_0x1f().Contains(0))
        {
            // Src1 may be too large to represent as a signed int32, and src2 may be zero.
            // Since the result can therefore be too large to represent as a signed int32,
            // include Number in the value type.
            return CreateDstUntransferredValue(
                ValueType::AnyNumber.SetCanBeTaggedValue(true), instr, src1Val, src2Val);
        }

        this->PropagateIntRangeBinary(instr, min1, max1, min2, max2, &newMin, &newMax);
        return CreateDstUntransferredIntValue(newMin, newMax, instr, src1Val, src2Val);
    }

    case Js::OpCode::Incr_A:
    case Js::OpCode::Decr_A:
    {
        ValueType valueType;
        if(src1Val)
        {
            valueType = src1Val->GetValueInfo()->Type().ToDefiniteAnyNumber();
        }
        else
        {
            valueType = ValueType::Number;
        }
        return CreateDstUntransferredValue(valueType.SetCanBeTaggedValue(true), instr, src1Val, src2Val);
    }

    case Js::OpCode::Add_A:
    {
        ValueType valueType;
        if (src1Val && src1ValueInfo->IsLikelyNumber() && src2Val && src2ValueInfo->IsLikelyNumber())
        {
            if(src1ValueInfo->IsLikelyInt() && src2ValueInfo->IsLikelyInt())
            {
                // When doing aggressiveIntType, just assume the result is likely going to be int
                // if both input is int.
                const bool isLikelyTagged = src1ValueInfo->IsLikelyTaggedInt() && src2ValueInfo->IsLikelyTaggedInt();
                if(src1ValueInfo->IsNumber() && src2ValueInfo->IsNumber())
                {
                    // If both of them are numbers then we can definitely say that the result is a number.
                    valueType = ValueType::GetNumberAndLikelyInt(isLikelyTagged);
                }
                else
                {
                    // This is only likely going to be int but can be a string as well.
                    valueType = ValueType::GetInt(isLikelyTagged).ToLikely();
                }
            }
            else
            {
                // We can only be certain of any thing if both of them are numbers.
                // Otherwise, the result could be string.
                if (src1ValueInfo->IsNumber() && src2ValueInfo->IsNumber())
                {
                    if (src1ValueInfo->IsFloat() || src2ValueInfo->IsFloat())
                    {
                        // If one of them is a float, the result probably is a float instead of just int
                        // but should always be a number.
                        valueType = ValueType::Float.SetCanBeTaggedValue(true);
                    }
                    else
                    {
                        // Could be int, could be number
                        valueType = ValueType::Number.SetCanBeTaggedValue(true);
                    }
                }
                else if (src1ValueInfo->IsLikelyFloat() || src2ValueInfo->IsLikelyFloat())
                {
                    // Result is likely a float (but can be anything)
                    valueType = ValueType::Float.ToLikely();
                }
                else
                {
                    // Otherwise it is a likely int or float (but can be anything)
                    valueType = ValueType::Number.ToLikely();
                }
            }
        }
        else if((src1Val && src1ValueInfo->IsString()) || (src2Val && src2ValueInfo->IsString()))
        {
            // String + anything should always result in a string
            valueType = ValueType::String;
        }
        else if((src1Val && src1ValueInfo->IsNotString() && src1ValueInfo->IsPrimitive())
            && (src2Val && src2ValueInfo->IsNotString() && src2ValueInfo->IsPrimitive()))
        {
            // If src1 and src2 are not strings and primitive, add should yield a number.
            valueType = ValueType::Number.SetCanBeTaggedValue(true);
        }
        else if((src1Val && src1ValueInfo->IsLikelyString()) || (src2Val && src2ValueInfo->IsLikelyString()))
        {
            // likelystring + anything should always result in a likelystring
            valueType = ValueType::String.ToLikely();
        }
        else
        {
            // Number or string. Could make the value a merge of Number and String, but Uninitialized is more useful at the moment.
            Assert(valueType.IsUninitialized());
        }

        return CreateDstUntransferredValue(valueType, instr, src1Val, src2Val);
    }

    case Js::OpCode::Div_A:
        {
            ValueType divValueType = GetDivValueType(instr, src1Val, src2Val, false);
            if (divValueType.IsLikelyInt() || divValueType.IsFloat())
            {
                return CreateDstUntransferredValue(divValueType.SetCanBeTaggedValue(true), instr, src1Val, src2Val);
            }
        }
        // fall-through

    case Js::OpCode::Sub_A:
    case Js::OpCode::Mul_A:
    case Js::OpCode::Rem_A:
    {
        ValueType valueType;
        if( src1Val &&
            src1ValueInfo->IsLikelyInt() &&
            src2Val &&
            src2ValueInfo->IsLikelyInt() &&
            instr->m_opcode != Js::OpCode::Div_A)
        {
            const bool isLikelyTagged =
                src1ValueInfo->IsLikelyTaggedInt() && (src2ValueInfo->IsLikelyTaggedInt() || instr->m_opcode == Js::OpCode::Rem_A);
            if(src1ValueInfo->IsNumber() && src2ValueInfo->IsNumber())
            {
                valueType = ValueType::GetNumberAndLikelyInt(isLikelyTagged);
            }
            else
            {
                valueType = ValueType::GetInt(isLikelyTagged).ToLikely();
            }
        }
        else if ((src1Val && src1ValueInfo->IsLikelyFloat()) || (src2Val && src2ValueInfo->IsLikelyFloat()))
        {
            // This should ideally be NewNumberAndLikelyFloatValue since we know the result is a number but not sure if it will
            // be a float value. However, that Number/LikelyFloat value type doesn't exist currently and all the necessary
            // checks are done for float values (tagged int checks, etc.) so it's sufficient to just create a float value here.
            valueType = ValueType::Float.SetCanBeTaggedValue(true);
        }
        else
        {
            valueType = ValueType::Number.SetCanBeTaggedValue(true);
        }

        return CreateDstUntransferredValue(valueType, instr, src1Val, src2Val);
    }

    case Js::OpCode::CallI:
        Assert(dst->IsRegOpnd());
        return NewGenericValue(dst->AsRegOpnd()->GetValueType(), dst);

    case Js::OpCode::LdElemI_A:
    {
        dstVal = ValueNumberLdElemDst(pInstr, src1Val);
        const ValueType baseValueType(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType());
        if( (
                baseValueType.IsLikelyNativeArray() ||
            #ifdef _M_IX86
                (
                    !AutoSystemInfo::Data.SSE2Available() &&
                    baseValueType.IsLikelyObject() &&
                    (
                        baseValueType.GetObjectType() == ObjectType::Float32Array ||
                        baseValueType.GetObjectType() == ObjectType::Float64Array
                    )
                )
            #else
                false
            #endif
            ) &&
            instr->GetDst()->IsVar() &&
            instr->HasBailOutInfo())
        {
            // The lowerer is not going to generate a fast path for this case. Remove any bailouts that require the fast
            // path. Note that the removed bailouts should not be necessary for correctness.
            IR::BailOutKind bailOutKind = instr->GetBailOutKind();
            if(bailOutKind & IR::BailOutOnArrayAccessHelperCall)
            {
                bailOutKind -= IR::BailOutOnArrayAccessHelperCall;
            }
            if(bailOutKind == IR::BailOutOnImplicitCallsPreOp)
            {
                bailOutKind -= IR::BailOutOnImplicitCallsPreOp;
            }
            if(bailOutKind)
            {
                instr->SetBailOutKind(bailOutKind);
            }
            else
            {
                instr->ClearBailOutInfo();
            }
        }
        return dstVal;
    }

    case Js::OpCode::LdMethodElem:
        // Not worth profiling this, just assume it's likely object (should be likely function but ValueType does not track
        // functions currently, so using ObjectType::Object instead)
        dstVal = NewGenericValue(ValueType::GetObject(ObjectType::Object).ToLikely(), dst);
        if(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyNativeArray() && instr->HasBailOutInfo())
        {
            // The lowerer is not going to generate a fast path for this case. Remove any bailouts that require the fast
            // path. Note that the removed bailouts should not be necessary for correctness.
            IR::BailOutKind bailOutKind = instr->GetBailOutKind();
            if(bailOutKind & IR::BailOutOnArrayAccessHelperCall)
            {
                bailOutKind -= IR::BailOutOnArrayAccessHelperCall;
            }
            if(bailOutKind == IR::BailOutOnImplicitCallsPreOp)
            {
                bailOutKind -= IR::BailOutOnImplicitCallsPreOp;
            }
            if(bailOutKind)
            {
                instr->SetBailOutKind(bailOutKind);
            }
            else
            {
                instr->ClearBailOutInfo();
            }
        }
        return dstVal;

    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        dstVal = this->ValueNumberTransferDst(instr, src1Val);
        break;

    case Js::OpCode::LdLen_A:
        if (instr->IsProfiledInstr())
        {
            const ValueType profiledValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            if(!(profiledValueType.IsLikelyInt() && dst->AsRegOpnd()->m_sym->m_isNotNumber))
            {
                return this->NewGenericValue(profiledValueType, dst);
            }
        }
        break;

    case Js::OpCode::BrOnEmpty:
    case Js::OpCode::BrOnNotEmpty:
        Assert(dst->IsRegOpnd());
        Assert(dst->GetValueType().IsString());
        return this->NewGenericValue(ValueType::String, dst);

    case Js::OpCode::IsInst:
    case Js::OpCode::LdTrue:
    case Js::OpCode::LdFalse:
    case Js::OpCode::CmEq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmNeq_A:
    case Js::OpCode::CmSrNeq_A:
    case Js::OpCode::CmLe_A:
    case Js::OpCode::CmUnLe_A:
    case Js::OpCode::CmLt_A:
    case Js::OpCode::CmUnLt_A:
    case Js::OpCode::CmGe_A:
    case Js::OpCode::CmUnGe_A:
    case Js::OpCode::CmGt_A:
    case Js::OpCode::CmUnGt_A:
        return this->NewGenericValue(ValueType::Boolean, dst);

    case Js::OpCode::LdUndef:
        return this->NewGenericValue(ValueType::Undefined, dst);

    case Js::OpCode::LdC_A_Null:
        return this->NewGenericValue(ValueType::Null, dst);

    case Js::OpCode::LdThis:
        if (!PHASE_OFF(Js::OptTagChecksPhase, this->func) &&
            (src1ValueInfo == nullptr || src1ValueInfo->IsUninitialized()))
        {
            return this->NewGenericValue(ValueType::GetObject(ObjectType::Object).ToLikely().SetCanBeTaggedValue(false), dst);
        }
        break;

    case Js::OpCode::Typeof:
    case Js::OpCode::TypeofElem:
        return this->NewGenericValue(ValueType::String, dst);
    case Js::OpCode::InitLocalClosure:
        Assert(instr->GetDst());
        Assert(instr->GetDst()->IsRegOpnd());
        IR::RegOpnd *regOpnd = instr->GetDst()->AsRegOpnd();
        StackSym *opndStackSym = regOpnd->m_sym;
        Assert(opndStackSym != nullptr);
        ObjectSymInfo *objectSymInfo = opndStackSym->m_objectInfo;
        Assert(objectSymInfo != nullptr);
        for (PropertySym *localVarSlotList = objectSymInfo->m_propertySymList; localVarSlotList; localVarSlotList = localVarSlotList->m_nextInStackSymList)
        {
            this->slotSyms->Set(localVarSlotList->m_id);
        }
        break;
    }

    if (dstVal == nullptr)
    {
        return this->NewGenericValue(dst->GetValueType(), dst);
    }

    return CurrentBlockData()->SetValue(dstVal, dst);
}